

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

void formatFailMessage(char *msg,size_t maxMsgLen,char *failureMsg,char *val1,char *val2,
                      char *actual,char *expected,ComparisonOperation op)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *in_RCX;
  undefined8 in_RDX;
  size_t in_RSI;
  char *in_RDI;
  char *in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  ComparisonOperation in_stack_00000010;
  int written;
  anon_class_1_0_00000001 protect;
  int len2;
  int len1;
  char *in_stack_ffffffffffffff28;
  anon_class_1_0_00000001 local_29;
  int local_28;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = approx_wide_len(in_stack_ffffffffffffff28);
  local_28 = approx_wide_len(in_stack_ffffffffffffff28);
  iVar1 = snprintf(in_RDI,in_RSI,"%s\n",in_RDX);
  local_29 = (anon_class_1_0_00000001)0xaa;
  if ((in_RCX == (char *)0x0) && (in_R8 == (char *)0x0)) {
    pcVar4 = leftArgNameForOp(in_stack_00000010);
    pcVar6 = rightArgNameForOp(in_stack_00000010);
    snprintf(in_RDI + iVar1,in_RSI - (long)iVar1,"   %s: %s\n   %s: %s",pcVar4,in_R9,pcVar6,
             in_stack_00000008);
  }
  else {
    pcVar4 = leftArgNameForOp(in_stack_00000010);
    piVar5 = qMax<int>(&local_24,&local_28);
    iVar2 = *piVar5 - local_24;
    pcVar6 = formatFailMessage::anon_class_1_0_00000001::operator()(&local_29,in_RCX);
    pcVar7 = rightArgNameForOp(in_stack_00000010);
    piVar5 = qMax<int>(&local_24,&local_28);
    iVar3 = *piVar5 - local_28;
    pcVar8 = formatFailMessage::anon_class_1_0_00000001::operator()(&local_29,in_R8);
    snprintf(in_RDI + iVar1,in_RSI - (long)iVar1,"   %s(%s)%*s %s\n   %s(%s)%*s %s",pcVar4,in_R9,
             (ulong)(iVar2 + 1),":",pcVar6,pcVar7,in_stack_00000008,iVar3 + 1,":",pcVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static Q_DECL_COLD_FUNCTION
void formatFailMessage(char *msg, size_t maxMsgLen,
                       const char *failureMsg,
                       const char *val1, const char *val2,
                       const char *actual, const char *expected,
                       QTest::ComparisonOperation op)
{
    const auto len1 = approx_wide_len(actual);
    const auto len2 = approx_wide_len(expected);
    const int written = std::snprintf(msg, maxMsgLen, "%s\n", failureMsg);
    msg += written;
    maxMsgLen -= written;

    const auto protect = [](const char *s) { return s ? s : "<null>"; };

    if (val1 || val2) {
        std::snprintf(msg, maxMsgLen, "   %s(%s)%*s %s\n   %s(%s)%*s %s",
                      leftArgNameForOp(op), actual, qMax(len1, len2) - len1 + 1, ":",
                      protect(val1),
                      rightArgNameForOp(op), expected, qMax(len1, len2) - len2 + 1, ":",
                      protect(val2));
    } else {
        // only print variable names if neither value can be represented as a string
        std::snprintf(msg, maxMsgLen, "   %s: %s\n   %s: %s",
                      leftArgNameForOp(op), actual, rightArgNameForOp(op), expected);
    }
}